

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int subjRequiresPage(PgHdr *pPg)

{
  int iVar1;
  PCache *pPVar2;
  int iVar3;
  Pgno pgno;
  uint in_ESI;
  Pager *pPager;
  long lVar4;
  
  iVar1 = *(int *)&pPg[1].pDirtyNext;
  if ((long)iVar1 < 1) {
    return 0;
  }
  pPVar2 = pPg[1].pCache;
  lVar4 = 0;
  while ((*(uint *)((long)&pPVar2->nRef + lVar4) < in_ESI ||
         (iVar3 = sqlite3BitvecTest(*(Bitvec **)((long)&pPVar2->pSynced + lVar4),in_ESI), iVar3 != 0
         ))) {
    lVar4 = lVar4 + 0x30;
    if ((long)iVar1 * 0x30 == lVar4) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int subjRequiresPage(PgHdr *pPg){
  Pgno pgno = pPg->pgno;
  Pager *pPager = pPg->pPager;
  int i;
  for(i=0; i<pPager->nSavepoint; i++){
    PagerSavepoint *p = &pPager->aSavepoint[i];
    if( p->nOrig>=pgno && 0==sqlite3BitvecTest(p->pInSavepoint, pgno) ){
      return 1;
    }
  }
  return 0;
}